

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O2

bool crnlib::image_utils::write_to_file
               (char *pFilename,image_u8 *img,uint write_flags,int grayscale_comp_index)

{
  uchar uVar1;
  color_quad<unsigned_char,_int> *pcVar2;
  uint8 *pImage_data;
  undefined4 uVar3;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  void *pData;
  color_quad<unsigned_char,_int> *pcVar8;
  uint uVar9;
  long lVar10;
  uint y_1;
  ulong uVar11;
  code *pcVar12;
  uchar *puVar13;
  uint y;
  uint uVar14;
  size_t png_image_size;
  bool local_80;
  bool local_7f;
  bool local_7e;
  dynamic_string ext;
  vector<unsigned_char> temp;
  vector<unsigned_char> *local_50;
  
  if (grayscale_comp_index - 4U < 0xfffffffb) {
    return false;
  }
  if (img->m_width == 0) {
    return false;
  }
  dynamic_string::dynamic_string(&ext,pFilename);
  bVar5 = file_utils::get_extension(&ext);
  if (bVar5) {
    bVar6 = dynamic_string::operator==(&ext,"jpg");
    bVar5 = true;
    if (!bVar6) {
      bVar5 = dynamic_string::operator==(&ext,"jpeg");
    }
    bVar6 = dynamic_string::operator!=(&ext,"png");
    if (((bVar6) && (bVar6 = dynamic_string::operator!=(&ext,"bmp"), bVar6)) &&
       (bVar6 = dynamic_string::operator!=(&ext,"tga"), bVar6 && bVar5 == false)) {
      bVar5 = false;
      console::error(
                    "crnlib::image_utils::write_to_file: Can only write .BMP, .TGA, .PNG, or .JPG files!\n"
                    );
      goto LAB_00115a9f;
    }
    write_flags = write_flags | bVar5;
  }
  else {
    bVar5 = false;
  }
  temp.m_size = 0;
  temp.m_capacity = 0;
  temp.m_p = (uchar *)0x0;
  if ((write_flags & 2) == 0 && (img->m_comp_flags & 0x10) == 0) {
    if (((write_flags & 1) == 0 & (byte)((img->m_comp_flags & 8) >> 3)) == 0) {
      local_50 = &temp;
      vector<unsigned_char>::resize(local_50,img->m_width * img->m_height * 3,false);
      iVar7 = 3;
      for (uVar14 = 0; uVar14 < img->m_height; uVar14 = uVar14 + 1) {
        pcVar8 = img->m_pPixels + img->m_pitch * uVar14;
        puVar13 = temp.m_p + img->m_width * uVar14 * 3;
        for (lVar10 = (ulong)img->m_width << 2; lVar10 != 0; lVar10 = lVar10 + -4) {
          paVar4 = &pcVar8->field_0;
          uVar1 = (pcVar8->field_0).field_0.b;
          pcVar8 = pcVar8 + 1;
          *(undefined2 *)puVar13 = *(undefined2 *)paVar4;
          puVar13[2] = uVar1;
          puVar13 = puVar13 + 3;
        }
      }
    }
    else {
      local_50 = (vector<unsigned_char> *)&img->m_pPixels;
      iVar7 = 4;
    }
  }
  else {
    local_50 = &temp;
    vector<unsigned_char>::resize(local_50,img->m_height * img->m_width,false);
    for (uVar14 = 0; uVar14 < img->m_height; uVar14 = uVar14 + 1) {
      pcVar2 = img->m_pPixels;
      uVar11 = (ulong)img->m_width;
      uVar9 = img->m_pitch * uVar14;
      pcVar8 = pcVar2 + uVar9;
      puVar13 = temp.m_p + img->m_width * uVar14;
      if ((img->m_comp_flags & 0x10) == 0) {
        if (grayscale_comp_index < 0) {
          for (lVar10 = uVar11 << 2; lVar10 != 0; lVar10 = lVar10 + -4) {
            iVar7 = color_quad<unsigned_char,_int>::get_luma(pcVar8);
            *puVar13 = (uchar)iVar7;
            puVar13 = puVar13 + 1;
            pcVar8 = pcVar8 + 1;
          }
        }
        else {
          for (lVar10 = 0; uVar11 << 2 != lVar10; lVar10 = lVar10 + 4) {
            *puVar13 = pcVar2[uVar9].field_0.c[lVar10 + (ulong)(uint)grayscale_comp_index];
            puVar13 = puVar13 + 1;
          }
        }
      }
      else {
        for (lVar10 = uVar11 << 2; lVar10 != 0; lVar10 = lVar10 + -4) {
          paVar4 = &pcVar8->field_0;
          pcVar8 = pcVar8 + 1;
          *puVar13 = (paVar4->field_0).g;
          puVar13 = puVar13 + 1;
        }
      }
    }
    iVar7 = 1;
  }
  pImage_data = local_50->m_p;
  bVar6 = dynamic_string::operator==(&ext,"png");
  if (bVar6) {
    png_image_size = 0;
    pData = tdefl_write_image_to_png_file_in_memory
                      (pImage_data,img->m_width,img->m_height,iVar7,&png_image_size);
    if (pData == (void *)0x0) {
      bVar5 = false;
    }
    else {
      bVar5 = file_utils::write_buf_to_file(pFilename,pData,png_image_size);
      mz_free(pData);
    }
    bVar5 = (bool)(pData != (void *)0x0 & bVar5);
  }
  else if (bVar5 == false) {
    bVar5 = dynamic_string::operator==(&ext,"bmp");
    pcVar12 = stbi_write_tga;
    if (bVar5) {
      pcVar12 = stbi_write_bmp;
    }
    iVar7 = (*pcVar12)(pFilename,img->m_width,img->m_height,iVar7,pImage_data);
    bVar5 = iVar7 == 1;
  }
  else {
    png_image_size = 0x300000055;
    local_7e = false;
    if (0xffffff < write_flags) {
      uVar14 = 100;
      if (write_flags >> 0x18 < 100) {
        uVar14 = write_flags >> 0x18;
      }
      png_image_size = CONCAT44(3,uVar14);
    }
    local_7f = (bool)((byte)(write_flags >> 0x13) & 1);
    local_80 = (bool)((byte)(write_flags >> 0x14) & 1);
    if ((write_flags >> 0x10 & 1) == 0) {
      if ((write_flags >> 0x11 & 1) != 0) {
        uVar3 = 2;
        goto LAB_00115a75;
      }
      if ((write_flags >> 0x12 & 1) != 0) {
        uVar3 = 3;
        goto LAB_00115a75;
      }
    }
    else {
      uVar3 = 1;
LAB_00115a75:
      png_image_size = CONCAT44(uVar3,(undefined4)png_image_size);
    }
    bVar5 = jpge::compress_image_to_jpeg_file
                      (pFilename,img->m_width,img->m_height,iVar7,pImage_data,
                       (params *)&png_image_size);
  }
  vector<unsigned_char>::~vector(&temp);
LAB_00115a9f:
  dynamic_string::~dynamic_string(&ext);
  return bVar5;
}

Assistant:

bool write_to_file(const char* pFilename, const image_u8& img, uint write_flags, int grayscale_comp_index)
        {
            if ((grayscale_comp_index < -1) || (grayscale_comp_index > 3))
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            if (!img.get_width())
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            dynamic_string ext(pFilename);
            bool is_jpeg = false;
            if (file_utils::get_extension(ext))
            {
                is_jpeg = ((ext == "jpg") || (ext == "jpeg"));

                if ((ext != "png") && (ext != "bmp") && (ext != "tga") && (!is_jpeg))
                {
                    console::error("crnlib::image_utils::write_to_file: Can only write .BMP, .TGA, .PNG, or .JPG files!\n");
                    return false;
                }
            }

            crnlib::vector<uint8> temp;
            uint num_src_chans = 0;
            const void* pSrc_img = nullptr;

            if (is_jpeg)
            {
                write_flags |= cWriteFlagIgnoreAlpha;
            }

            if ((img.get_comp_flags() & pixel_format_helpers::cCompFlagGrayscale) || (write_flags & image_utils::cWriteFlagGrayscale))
            {
                CRNLIB_ASSERT(grayscale_comp_index < 4);
                if (grayscale_comp_index > 3)
                {
                    grayscale_comp_index = 3;
                }

                temp.resize(img.get_total_pixels());

                for (uint y = 0; y < img.get_height(); y++)
                {
                    const color_quad_u8* pSrc = img.get_scanline(y);
                    const color_quad_u8* pSrc_end = pSrc + img.get_width();
                    uint8* pDst = &temp[y * img.get_width()];

                    if (img.get_comp_flags() & pixel_format_helpers::cCompFlagGrayscale)
                    {
                        while (pSrc != pSrc_end)
                        {
                            *pDst++ = (*pSrc++)[1];
                        }
                    }
                    else if (grayscale_comp_index < 0)
                    {
                        while (pSrc != pSrc_end)
                        {
                            *pDst++ = static_cast<uint8>((*pSrc++).get_luma());
                        }
                    }
                    else
                    {
                        while (pSrc != pSrc_end)
                        {
                            *pDst++ = (*pSrc++)[grayscale_comp_index];
                        }
                    }
                }

                pSrc_img = &temp[0];
                num_src_chans = 1;
            }
            else if ((!img.is_component_valid(3)) || (write_flags & cWriteFlagIgnoreAlpha))
            {
                temp.resize(img.get_total_pixels() * 3);

                for (uint y = 0; y < img.get_height(); y++)
                {
                    const color_quad_u8* pSrc = img.get_scanline(y);
                    const color_quad_u8* pSrc_end = pSrc + img.get_width();
                    uint8* pDst = &temp[y * img.get_width() * 3];

                    while (pSrc != pSrc_end)
                    {
                        const color_quad_u8 c(*pSrc++);

                        pDst[0] = c.r;
                        pDst[1] = c.g;
                        pDst[2] = c.b;

                        pDst += 3;
                    }
                }

                num_src_chans = 3;
                pSrc_img = &temp[0];
            }
            else
            {
                num_src_chans = 4;
                pSrc_img = img.get_ptr();
            }

            bool success = false;
            if (ext == "png")
            {
                size_t png_image_size = 0;
                void* pPNG_image_data = tdefl_write_image_to_png_file_in_memory(pSrc_img, img.get_width(), img.get_height(), num_src_chans, &png_image_size);
                if (!pPNG_image_data)
                {
                    return false;
                }
                success = file_utils::write_buf_to_file(pFilename, pPNG_image_data, png_image_size);
                mz_free(pPNG_image_data);
            }
            else if (is_jpeg)
            {
                jpge::params params;
                if (write_flags & cWriteFlagJPEGQualityLevelMask)
                {
                    params.m_quality = math::clamp<uint>((write_flags & cWriteFlagJPEGQualityLevelMask) >> cWriteFlagJPEGQualityLevelShift, 1U, 100U);
                }
                params.m_two_pass_flag = (write_flags & cWriteFlagJPEGTwoPass) != 0;
                params.m_no_chroma_discrim_flag = (write_flags & cWriteFlagJPEGNoChromaDiscrim) != 0;

                if (write_flags & cWriteFlagJPEGH1V1)
                {
                    params.m_subsampling = jpge::H1V1;
                }
                else if (write_flags & cWriteFlagJPEGH2V1)
                {
                    params.m_subsampling = jpge::H2V1;
                }
                else if (write_flags & cWriteFlagJPEGH2V2)
                {
                    params.m_subsampling = jpge::H2V2;
                }

                success = jpge::compress_image_to_jpeg_file(pFilename, img.get_width(), img.get_height(), num_src_chans, (const jpge::uint8*)pSrc_img, params);
            }
            else
            {
                success = ((ext == "bmp" ? stbi_write_bmp : stbi_write_tga)(pFilename, img.get_width(), img.get_height(), num_src_chans, pSrc_img) == CRNLIB_TRUE);
            }
            return success;
        }